

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeezenetssd.cpp
# Opt level: O0

void draw_objects(Mat *bgr,vector<Object,_std::allocator<Object>_> *objects)

{
  ulong uVar1;
  size_type sVar2;
  vector<Object,_std::allocator<Object>_> *in_RSI;
  int y;
  int x;
  Size label_size;
  int baseLine;
  char text [256];
  Object *obj;
  size_t i;
  Mat image;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  Mat *in_stack_fffffffffffffcb8;
  _InputOutputArray *in_stack_fffffffffffffcc0;
  allocator *paVar3;
  Rect_<float> *in_stack_fffffffffffffcc8;
  Scalar_<double> *in_stack_fffffffffffffcd0;
  _InputArray local_318;
  allocator local_2f9;
  string local_2f8 [32];
  undefined1 local_2d8 [36];
  Point_<int> local_2b4;
  undefined1 local_2a9 [33];
  undefined1 local_288 [24];
  undefined1 local_270 [32];
  Size_<int> local_250;
  Point_<int> local_248;
  Rect_<int> local_240;
  undefined1 local_230 [28];
  int local_214;
  int local_210;
  allocator local_209;
  string local_208 [36];
  int local_1e4;
  int local_1e0;
  int local_1dc;
  Scalar_<double> local_1d8 [8];
  undefined1 local_d8 [36];
  undefined1 local_b4 [28];
  undefined1 local_98 [24];
  const_reference local_80;
  ulong local_78;
  Mat local_70 [12];
  int local_64;
  vector<Object,_std::allocator<Object>_> *local_10;
  
  local_10 = in_RSI;
  cv::Mat::clone();
  local_78 = 0;
  while( true ) {
    uVar1 = local_78;
    sVar2 = std::vector<Object,_std::allocator<Object>_>::size(local_10);
    if (sVar2 <= uVar1) break;
    local_80 = std::vector<Object,_std::allocator<Object>_>::operator[](local_10,local_78);
    fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",(double)local_80->prob,
            (double)(local_80->rect).x,(double)(local_80->rect).y,(double)(local_80->rect).width,
            (double)(local_80->rect).height,(ulong)(uint)local_80->label);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    cv::Rect_::operator_cast_to_Rect_(in_stack_fffffffffffffcc8);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffcd0,(double)in_stack_fffffffffffffcc8,
               (double)in_stack_fffffffffffffcc0,(double)in_stack_fffffffffffffcb8,
               (double)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    cv::rectangle(local_98,local_b4,local_d8,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x140dd7);
    in_stack_fffffffffffffcd0 = local_1d8;
    sprintf((char *)in_stack_fffffffffffffcd0,"%s %.1f%%",(double)(local_80->prob * 100.0),
            draw_objects::class_names[local_80->label]);
    local_1dc = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,(char *)in_stack_fffffffffffffcd0,&local_209);
    cv::getTextSize((string *)&local_1e4,(int)local_208,0.5,0,(int *)0x1);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    local_210 = (int)(local_80->rect).x;
    local_214 = (int)(((local_80->rect).y - (float)local_1e0) - (float)local_1dc);
    if (local_214 < 0) {
      local_214 = 0;
    }
    if (local_64 < local_210 + local_1e4) {
      local_210 = local_64 - local_1e4;
    }
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    cv::Point_<int>::Point_(&local_248,local_210,local_214);
    cv::Size_<int>::Size_(&local_250,local_1e4,local_1e0 + local_1dc);
    cv::Rect_<int>::Rect_(&local_240,&local_248,&local_250);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffcd0,(double)in_stack_fffffffffffffcc8,
               (double)in_stack_fffffffffffffcc0,(double)in_stack_fffffffffffffcb8,
               (double)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    cv::rectangle(local_230,&local_240,local_270,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x141086);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcc8 = (Rect_<float> *)local_2a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_2a9 + 1),(char *)local_1d8,(allocator *)in_stack_fffffffffffffcc8);
    cv::Point_<int>::Point_(&local_2b4,local_210,local_214 + local_1e0);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffcd0,(double)in_stack_fffffffffffffcc8,
               (double)in_stack_fffffffffffffcc0,(double)in_stack_fffffffffffffcb8,
               (double)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    in_stack_fffffffffffffcb0 = 0;
    in_stack_fffffffffffffca8 = 8;
    cv::putText(0x3fe0000000000000,local_288,local_2a9 + 1,&local_2b4,0,local_2d8);
    std::__cxx11::string::~string((string *)(local_2a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2a9);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x14117a);
    local_78 = local_78 + 1;
  }
  paVar3 = &local_2f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"image",paVar3);
  cv::_InputArray::_InputArray
            ((_InputArray *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
             (Mat *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  cv::imshow(local_2f8,&local_318);
  cv::_InputArray::~_InputArray(&local_318);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  cv::waitKey(0);
  cv::Mat::~Mat(local_70);
  return;
}

Assistant:

static void draw_objects(const cv::Mat& bgr, const std::vector<Object>& objects)
{
    static const char* class_names[] = {"background",
                                        "aeroplane", "bicycle", "bird", "boat",
                                        "bottle", "bus", "car", "cat", "chair",
                                        "cow", "diningtable", "dog", "horse",
                                        "motorbike", "person", "pottedplant",
                                        "sheep", "sofa", "train", "tvmonitor"
                                       };

    cv::Mat image = bgr.clone();

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];

        fprintf(stderr, "%d = %.5f at %.2f %.2f %.2f x %.2f\n", obj.label, obj.prob,
                obj.rect.x, obj.rect.y, obj.rect.width, obj.rect.height);

        cv::rectangle(image, obj.rect, cv::Scalar(255, 0, 0));

        char text[256];
        sprintf(text, "%s %.1f%%", class_names[obj.label], obj.prob * 100);

        int baseLine = 0;
        cv::Size label_size = cv::getTextSize(text, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);

        int x = obj.rect.x;
        int y = obj.rect.y - label_size.height - baseLine;
        if (y < 0)
            y = 0;
        if (x + label_size.width > image.cols)
            x = image.cols - label_size.width;

        cv::rectangle(image, cv::Rect(cv::Point(x, y), cv::Size(label_size.width, label_size.height + baseLine)),
                      cv::Scalar(255, 255, 255), -1);

        cv::putText(image, text, cv::Point(x, y + label_size.height),
                    cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0, 0, 0));
    }

    cv::imshow("image", image);
    cv::waitKey(0);
}